

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

char * __thiscall
CTcConstVal::cvt_to_str(CTcConstVal *this,char *buf,size_t bufl,size_t *result_len)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  CTcConstVal *in_RDI;
  char *local_8;
  
  local_8 = in_RSI;
  switch(in_RDI->typ_) {
  case TC_CVT_NIL:
    if (in_RDX < 4) {
      local_8 = (char *)0x0;
    }
    else {
      strcpy(in_RSI,"nil");
      *in_RCX = 3;
    }
    break;
  case TC_CVT_TRUE:
    if (in_RDX < 5) {
      local_8 = (char *)0x0;
    }
    else {
      strcpy(in_RSI,"true");
      *in_RCX = 4;
    }
    break;
  case TC_CVT_INT:
    if (in_RDX < 0xc) {
      local_8 = (char *)0x0;
    }
    else {
      lVar1 = get_val_int(in_RDI);
      sprintf(in_RSI,"%ld",lVar1);
      sVar2 = strlen(in_RSI);
      *in_RCX = sVar2;
    }
    break;
  case TC_CVT_SSTR:
    sVar3 = get_val_str_len(in_RDI);
    *in_RCX = sVar3;
    local_8 = get_val_str(in_RDI);
    break;
  default:
    local_8 = (char *)0x0;
    break;
  case TC_CVT_FLOAT:
    sVar3 = get_val_float_len(in_RDI);
    *in_RCX = sVar3;
    local_8 = get_val_float(in_RDI);
  }
  return local_8;
}

Assistant:

const char *CTcConstVal::cvt_to_str(char *buf, size_t bufl,
                                    size_t *result_len)
{
    /* check my type */
    switch(typ_)
    {
    case TC_CVT_NIL:
        /* the result is "nil" */
        if (bufl < 4)
            return 0;

        strcpy(buf, "nil");
        *result_len = 3;
        return buf;

    case TC_CVT_TRUE:
        /* the result is "true" */
        if (bufl < 5)
            return 0;

        strcpy(buf, "true");
        *result_len = 4;
        return buf;

    case TC_CVT_SSTR:
        /* it's already a string */
        *result_len = get_val_str_len();
        return get_val_str();

    case TC_CVT_INT:
        /* convert our signed integer value */
        if (bufl < 12)
            return 0;

        sprintf(buf, "%ld", get_val_int());
        *result_len = strlen(buf);
        return buf;

    case TC_CVT_FLOAT:
        /* we store these as strings */
        *result_len = get_val_float_len();
        return get_val_float();

    default:
        /* can't convert other types */
        return 0;
    }
}